

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcServer.cpp
# Opt level: O2

void __thiscall XmlRpc::XmlRpcServer::enableIntrospection(XmlRpcServer *this,bool enabled)

{
  XmlRpcServerMethod *pXVar1;
  
  if ((bool)(this->super_XmlRpcSource).field_0xe != enabled) {
    (this->super_XmlRpcSource).field_0xe = enabled;
    if (!enabled) {
      removeMethod(this,&LIST_METHODS_abi_cxx11_);
      removeMethod(this,&METHOD_HELP_abi_cxx11_);
      return;
    }
    if (this->_listMethods != (XmlRpcServerMethod *)0x0) {
      addMethod(this,this->_listMethods);
      addMethod(this,this->_methodHelp);
      return;
    }
    pXVar1 = (XmlRpcServerMethod *)operator_new(0x30);
    ListMethods::ListMethods((ListMethods *)pXVar1,this);
    this->_listMethods = pXVar1;
    pXVar1 = (XmlRpcServerMethod *)operator_new(0x30);
    MethodHelp::MethodHelp((MethodHelp *)pXVar1,this);
    this->_methodHelp = pXVar1;
  }
  return;
}

Assistant:

void XmlRpcServer::enableIntrospection(bool enabled)
{
  if (_introspectionEnabled == enabled)
    return;

  _introspectionEnabled = enabled;

  if (enabled)
  {
    if ( ! _listMethods)
    {
      _listMethods = new ListMethods(this);
      _methodHelp = new MethodHelp(this);
    } else {
      addMethod(_listMethods);
      addMethod(_methodHelp);
    }
  }
  else
  {
    removeMethod(LIST_METHODS);
    removeMethod(METHOD_HELP);
  }
}